

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promises.cpp
# Opt level: O1

shared_ptr<SchemeObject> make_promise(shared_ptr<ASTNode> *body,Context *context)

{
  _List_node_base *p_Var1;
  element_type *peVar2;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<SchemeObject> sVar4;
  shared_ptr<SchemeCompoundProcedure> f;
  undefined1 local_71;
  shared_ptr<SchemeCompoundProcedure> local_70;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_48;
  _List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> local_38;
  
  local_70.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SchemeCompoundProcedure,std::allocator<SchemeCompoundProcedure>>
            (&local_70.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SchemeCompoundProcedure **)&local_70,
             (allocator<SchemeCompoundProcedure> *)&local_60);
  peVar2 = local_70.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (&(local_70.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       context != (Context *)in_RDX) {
    std::__cxx11::
    list<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>,std::allocator<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>>>
    ::
    _M_assign_dispatch<std::_List_const_iterator<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>>>
              ((list<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>,std::allocator<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>>>
                *)&(local_70.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->context,*in_RDX);
  }
  (peVar2->context).toplevel = *(bool *)(in_RDX + 3);
  p_Var1 = (context->locals).
           super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_60 = (element_type *)CONCAT44(local_60._4_4_,*(undefined4 *)&p_Var1->_M_next);
  local_58[0]._M_pi = &local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,p_Var1->_M_prev,
             (long)&p_Var1->_M_prev->_M_next + (long)p_Var1[1]._M_next);
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::list
            ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)&local_38
             ,(list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
              ((long)(p_Var1 + 2) + 8));
  std::__cxx11::list<ASTNode,std::allocator<ASTNode>>::_M_assign_dispatch<ASTNode_const*>
            ((list<ASTNode,std::allocator<ASTNode>> *)
             &(local_70.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->body,&local_60,&stack0xffffffffffffffe0);
  std::__cxx11::_List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
  _M_clear(&local_38);
  if (local_58[0]._M_pi != &local_48) {
    operator_delete(local_58[0]._M_pi,(long)local_48._vptr__Sp_counted_base + 1);
  }
  local_60 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SchemePromise,std::allocator<SchemePromise>,std::shared_ptr<SchemeCompoundProcedure>&>
            (local_58,(SchemePromise **)&local_60,(allocator<SchemePromise> *)&local_71,&local_70);
  _Var3._M_pi = local_58[0]._M_pi;
  (body->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_60;
  (body->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (body->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = _Var3._M_pi;
  _Var3._M_pi = extraout_RDX;
  if (local_70.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)body;
  return (shared_ptr<SchemeObject>)
         sVar4.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<SchemeObject> make_promise(std::shared_ptr<ASTNode> body, const Context &context)
{
    auto f = std::make_shared<SchemeCompoundProcedure>();
    f->context = context;
    f->body = {*body};
    return std::make_shared<SchemePromise>(f);
}